

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_geometry.cpp
# Opt level: O1

void __thiscall embree::Tutorial::Tutorial(Tutorial *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"lazy_geometry","");
  TutorialApplication::TutorialApplication(&this->super_TutorialApplication,&local_38,1,0x200,0x200)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_TutorialApplication).super_Application._vptr_Application =
       (_func_int **)&PTR__TutorialApplication_002c0cc0;
  *(undefined8 *)&(this->super_TutorialApplication).camera.from.field_0 = 0x4020000040200000;
  *(undefined8 *)((long)&(this->super_TutorialApplication).camera.from.field_0 + 8) = 0x40200000;
  *(undefined8 *)&(this->super_TutorialApplication).camera.to.field_0 = 0;
  *(undefined8 *)((long)&(this->super_TutorialApplication).camera.to.field_0 + 8) = 0;
  return;
}

Assistant:

Tutorial()
      : TutorialApplication("lazy_geometry",FEATURE_RTCORE) 
    {
      /* set default camera */
      camera.from = Vec3fa(2.5f,2.5f,2.5f);
      camera.to   = Vec3fa(0.0f,0.0f,0.0f);
    }